

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

QMenu * __thiscall QLineEdit::createStandardContextMenu(QLineEdit *this)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  ushort uVar5;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_00;
  QAction *pQVar6;
  QUnicodeControlCharacterMenu *this_01;
  ConnectionType type;
  QKeySequence *pQVar7;
  long in_FS_OFFSET;
  QAnyStringView QVar8;
  Object local_2d8 [8];
  QKeySequence local_2d0 [8];
  QArrayDataPointer<char16_t> local_2c8;
  QStringBuilder<char16_t,_QString> local_2a8;
  QKeySequence local_280 [8];
  QArrayDataPointer<char16_t> local_278;
  Object local_260 [8];
  Object local_258 [8];
  QKeySequence local_250 [8];
  QArrayDataPointer<char16_t> local_248;
  QStringBuilder<char16_t,_QString> local_228;
  QKeySequence local_200 [8];
  QArrayDataPointer<char16_t> local_1f8;
  Object local_1d8 [8];
  QKeySequence local_1d0 [8];
  QArrayDataPointer<char16_t> local_1c8;
  QStringBuilder<char16_t,_QString> local_1a8;
  QKeySequence local_180 [8];
  QArrayDataPointer<char16_t> local_178;
  Object local_158 [8];
  QKeySequence local_150 [8];
  QArrayDataPointer<char16_t> local_148;
  QStringBuilder<char16_t,_QString> local_130;
  QKeySequence local_110 [8];
  Object local_108 [8];
  QKeySequence local_100 [8];
  QArrayDataPointer<char16_t> local_f8;
  QStringBuilder<char16_t,_QString> local_e0;
  QKeySequence local_c0 [8];
  Object local_b8 [8];
  QKeySequence local_b0 [8];
  QArrayDataPointer<char16_t> local_a8;
  QStringBuilder<char16_t,_QString> local_90;
  QKeySequence local_70 [8];
  QStringBuilder<QString,_QString> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  this_00.m_data = operator_new(0x28);
  QMenu::QMenu((QMenu *)this_00.m_data,&this->super_QWidget);
  QVar8.m_size = (size_t)"qt_edit_menu";
  QVar8.field_0.m_data = this_00.m_data;
  QObject::setObjectName(QVar8);
  uVar5 = *(ushort *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50);
  type = (ConnectionType)this;
  if ((uVar5 & 4) == 0) {
    tr((QString *)&local_130,"&Undo",(char *)0x0,-1);
    bVar2 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar2 == 0) {
      pQVar7 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_70,Undo);
      cVar3 = QShortcutMap::hasShortcutForKeySequence(pQVar7);
      if (cVar3 != '\0') goto LAB_003edf81;
      QKeySequence::QKeySequence(local_b0,Undo);
      QKeySequence::toString((SequenceFormat)&local_a8);
      local_90.b.d.size = local_a8.size;
      local_90.b.d.ptr = local_a8.ptr;
      local_90.b.d.d = local_a8.d;
      local_90.a = L'\t';
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_1a8,&local_90);
      bVar4 = true;
      bVar2 = 1;
    }
    else {
LAB_003edf81:
      bVar2 = bVar2 ^ 1;
      local_1a8.a = L'\0';
      local_1a8._2_6_ = 0;
      local_1a8.b.d.d = (Data *)0x0;
      local_1a8.b.d.ptr = (char16_t *)0x0;
      bVar4 = false;
    }
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_68,(QString *)&local_130,(QString *)&local_1a8);
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_e0,&local_68);
    pQVar6 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_e0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e0);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a8);
    if (bVar4) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QKeySequence::~QKeySequence(local_b0);
    }
    if (bVar2 != 0) {
      QKeySequence::~QKeySequence(local_70);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_130);
    QWidgetLineControl::isUndoAvailable(*(QWidgetLineControl **)(lVar1 + 600));
    QAction::setEnabled(SUB81(pQVar6,0));
    local_68.a.d.d = (Data *)0x0;
    local_e0.a = L'\0';
    local_e0._2_6_ = 0;
    local_e0.b.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-undo";
    local_e0.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 9;
    QObject::doSetObjectName((QString *)pQVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e0);
    local_e0.a = L'\0';
    local_e0._2_6_ = 0;
    local_e0.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-undo";
    local_e0.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 9;
    setActionIcon(pQVar6,&local_68.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e0);
    local_68.a.d.d = (Data *)undo;
    local_68.a.d.ptr = (char16_t *)0x0;
    QObject::connect<void(QAction::*)(bool),void(QLineEdit::*)()>
              (local_b8,(offset_in_QAction_to_subr)pQVar6,(ContextType *)QAction::triggered,
               (offset_in_QLineEdit_to_subr *)0x0,type);
    QMetaObject::Connection::~Connection((Connection *)local_b8);
    tr((QString *)&local_1a8,"&Redo",(char *)0x0,-1);
    bVar2 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar2 == 0) {
      pQVar7 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_c0,Redo);
      cVar3 = QShortcutMap::hasShortcutForKeySequence(pQVar7);
      if (cVar3 != '\0') goto LAB_003ee1f7;
      QKeySequence::QKeySequence(local_100,Redo);
      QKeySequence::toString((SequenceFormat)&local_f8);
      local_e0.b.d.size = local_f8.size;
      local_e0.b.d.ptr = local_f8.ptr;
      local_e0.b.d.d = local_f8.d;
      local_e0.a = L'\t';
      local_f8.d = (Data *)0x0;
      local_f8.ptr = (char16_t *)0x0;
      local_f8.size = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_228,&local_e0);
      bVar4 = true;
      bVar2 = 1;
    }
    else {
LAB_003ee1f7:
      bVar2 = bVar2 ^ 1;
      local_228.a = L'\0';
      local_228._2_6_ = 0;
      local_228.b.d.d = (Data *)0x0;
      local_228.b.d.ptr = (char16_t *)0x0;
      bVar4 = false;
    }
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_68,(QString *)&local_1a8,(QString *)&local_228);
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_130,&local_68);
    pQVar6 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_130);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_130);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_228);
    if (bVar4) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      QKeySequence::~QKeySequence(local_100);
    }
    if (bVar2 != 0) {
      QKeySequence::~QKeySequence(local_c0);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a8);
    QWidgetLineControl::isRedoAvailable(*(QWidgetLineControl **)(lVar1 + 600));
    QAction::setEnabled(SUB81(pQVar6,0));
    local_68.a.d.d = (Data *)0x0;
    local_130.a = L'\0';
    local_130._2_6_ = 0;
    local_130.b.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-redo";
    local_130.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 9;
    QObject::doSetObjectName((QString *)pQVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_130);
    local_130.a = L'\0';
    local_130._2_6_ = 0;
    local_130.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-redo";
    local_130.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 9;
    setActionIcon(pQVar6,&local_68.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_130);
    local_68.a.d.d = (Data *)redo;
    local_68.a.d.ptr = (char16_t *)0x0;
    QObject::connect<void(QAction::*)(bool),void(QLineEdit::*)()>
              (local_108,(offset_in_QAction_to_subr)pQVar6,(ContextType *)QAction::triggered,
               (offset_in_QLineEdit_to_subr *)0x0,type);
    QMetaObject::Connection::~Connection((Connection *)local_108);
    QMenu::addSeparator((QMenu *)this_00.m_data);
    uVar5 = *(ushort *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50);
  }
  if ((uVar5 & 4) == 0) {
    tr((QString *)&local_228,"Cu&t",(char *)0x0,-1);
    bVar2 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar2 == 0) {
      pQVar7 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_110,Cut);
      cVar3 = QShortcutMap::hasShortcutForKeySequence(pQVar7);
      if (cVar3 != '\0') goto LAB_003ee48d;
      QKeySequence::QKeySequence(local_150,Cut);
      QKeySequence::toString((SequenceFormat)&local_148);
      local_130.b.d.size = local_148.size;
      local_130.b.d.ptr = local_148.ptr;
      local_130.b.d.d = local_148.d;
      local_130.a = L'\t';
      local_148.d = (Data *)0x0;
      local_148.ptr = (char16_t *)0x0;
      local_148.size = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_2a8,&local_130);
      bVar2 = 1;
      bVar4 = true;
    }
    else {
LAB_003ee48d:
      bVar2 = bVar2 ^ 1;
      local_2a8.a = L'\0';
      local_2a8._2_6_ = 0;
      local_2a8.b.d.d = (Data *)0x0;
      local_2a8.b.d.ptr = (char16_t *)0x0;
      bVar4 = false;
    }
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_68,(QString *)&local_228,(QString *)&local_2a8);
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_1a8,&local_68);
    pQVar6 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_1a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a8);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8);
    if (bVar4) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_130.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
      QKeySequence::~QKeySequence(local_150);
    }
    if (bVar2 != 0) {
      QKeySequence::~QKeySequence(local_110);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_228);
    QAction::setEnabled(SUB81(pQVar6,0));
    local_68.a.d.d = (Data *)0x0;
    local_1a8.a = L'\0';
    local_1a8._2_6_ = 0;
    local_1a8.b.d.d = (Data *)0x0;
    local_1a8.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.ptr = L"edit-cut";
    local_68.a.d.size = 8;
    QObject::doSetObjectName((QString *)pQVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a8);
    local_1a8.a = L'\0';
    local_1a8._2_6_ = 0;
    local_1a8.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-cut";
    local_1a8.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 8;
    setActionIcon(pQVar6,&local_68.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a8);
    local_68.a.d.d = (Data *)cut;
    local_68.a.d.ptr = (char16_t *)0x0;
    QObject::connect<void(QAction::*)(bool),void(QLineEdit::*)()>
              (local_158,(offset_in_QAction_to_subr)pQVar6,(ContextType *)QAction::triggered,
               (offset_in_QLineEdit_to_subr *)0x0,type);
    QMetaObject::Connection::~Connection((Connection *)local_158);
  }
  tr((QString *)&local_2a8,"&Copy",(char *)0x0,-1);
  bVar2 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
  if (bVar2 == 0) {
    pQVar7 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
    QKeySequence::QKeySequence(local_180,Copy);
    cVar3 = QShortcutMap::hasShortcutForKeySequence(pQVar7);
    if (cVar3 != '\0') goto LAB_003ee713;
    QKeySequence::QKeySequence(local_1d0,Copy);
    QKeySequence::toString((SequenceFormat)&local_1c8);
    local_1a8.b.d.size = local_1c8.size;
    local_1a8.b.d.ptr = local_1c8.ptr;
    local_1a8.b.d.d = local_1c8.d;
    local_1a8.a = L'\t';
    local_1c8.d = (Data *)0x0;
    local_1c8.ptr = (char16_t *)0x0;
    local_1c8.size = 0;
    QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_178,&local_1a8);
    bVar2 = 1;
    bVar4 = true;
  }
  else {
LAB_003ee713:
    bVar2 = bVar2 ^ 1;
    local_178.d = (Data *)0x0;
    local_178.ptr = (char16_t *)0x0;
    local_178.size = 0;
    bVar4 = false;
  }
  QStringBuilder<QString,_QString>::QStringBuilder
            (&local_68,(QString *)&local_2a8,(QString *)&local_178);
  QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_228,&local_68);
  pQVar6 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_228);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_228);
  QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
  if (bVar4) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8.b.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
    QKeySequence::~QKeySequence(local_1d0);
  }
  if (bVar2 != 0) {
    QKeySequence::~QKeySequence(local_180);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8);
  QAction::setEnabled(SUB81(pQVar6,0));
  local_68.a.d.d = (Data *)0x0;
  local_228.a = L'\0';
  local_228._2_6_ = 0;
  local_228.b.d.d = (Data *)0x0;
  local_68.a.d.ptr = L"edit-copy";
  local_228.b.d.ptr = (char16_t *)0x0;
  local_68.a.d.size = 9;
  QObject::doSetObjectName((QString *)pQVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_228);
  local_228.a = L'\0';
  local_228._2_6_ = 0;
  local_228.b.d.d = (Data *)0x0;
  local_68.a.d.d = (Data *)0x0;
  local_68.a.d.ptr = L"edit-copy";
  local_228.b.d.ptr = (char16_t *)0x0;
  local_68.a.d.size = 9;
  setActionIcon(pQVar6,&local_68.a);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_228);
  local_68.a.d.d = (Data *)copy;
  local_68.a.d.ptr = (char16_t *)0x0;
  QObject::connect<void(QAction::*)(bool),void(QLineEdit::*)()const>
            (local_1d8,(offset_in_QAction_to_subr)pQVar6,(ContextType *)QAction::triggered,
             (offset_in_QLineEdit_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_1d8);
  uVar5 = *(ushort *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50);
  if ((uVar5 & 4) == 0) {
    tr((QString *)&local_178,"&Paste",(char *)0x0,-1);
    bVar2 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar2 == 0) {
      pQVar7 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_200,Paste);
      cVar3 = QShortcutMap::hasShortcutForKeySequence(pQVar7);
      if (cVar3 != '\0') goto LAB_003ee9b2;
      QKeySequence::QKeySequence(local_250,Paste);
      QKeySequence::toString((SequenceFormat)&local_248);
      local_228.b.d.size = local_248.size;
      local_228.b.d.ptr = local_248.ptr;
      local_228.b.d.d = local_248.d;
      local_228.a = L'\t';
      local_248.d = (Data *)0x0;
      local_248.ptr = (char16_t *)0x0;
      local_248.size = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_1f8,&local_228);
      bVar2 = 1;
      bVar4 = true;
    }
    else {
LAB_003ee9b2:
      bVar2 = bVar2 ^ 1;
      local_1f8.d = (Data *)0x0;
      local_1f8.ptr = (char16_t *)0x0;
      local_1f8.size = 0;
      bVar4 = false;
    }
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_68,(QString *)&local_178,(QString *)&local_1f8);
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_2a8,&local_68);
    pQVar6 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_2a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1f8);
    if (bVar4) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_228.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_248);
      QKeySequence::~QKeySequence(local_250);
    }
    if (bVar2 != 0) {
      QKeySequence::~QKeySequence(local_200);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
    if ((*(byte *)(*(long *)(lVar1 + 600) + 0x50) & 4) == 0) {
      QGuiApplication::clipboard();
      QClipboard::text((Mode)&local_68);
      QAction::setEnabled(SUB81(pQVar6,0));
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    }
    else {
      QAction::setEnabled(SUB81(pQVar6,0));
    }
    local_68.a.d.d = (Data *)0x0;
    local_2a8.a = L'\0';
    local_2a8._2_6_ = 0;
    local_2a8.b.d.d = (Data *)0x0;
    local_2a8.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.ptr = L"edit-paste";
    local_68.a.d.size = 10;
    QObject::doSetObjectName((QString *)pQVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8);
    local_2a8.a = L'\0';
    local_2a8._2_6_ = 0;
    local_2a8.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-paste";
    local_2a8.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 10;
    setActionIcon(pQVar6,&local_68.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8);
    local_68.a.d.d = (Data *)paste;
    local_68.a.d.ptr = (char16_t *)0x0;
    QObject::connect<void(QAction::*)(bool),void(QLineEdit::*)()>
              (local_258,(offset_in_QAction_to_subr)pQVar6,(ContextType *)QAction::triggered,
               (offset_in_QLineEdit_to_subr *)0x0,type);
    QMetaObject::Connection::~Connection((Connection *)local_258);
    uVar5 = *(ushort *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50);
  }
  if ((uVar5 & 4) == 0) {
    tr(&local_68.a,"Delete",(char *)0x0,-1);
    pQVar6 = QWidget::addAction((QWidget *)this_00.m_data,&local_68.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    if (((byte)(*(QWidgetLineControl **)(lVar1 + 600))[0x50] & 4) == 0) {
      QWidgetLineControl::text(&local_68.a,*(QWidgetLineControl **)(lVar1 + 600));
      QAction::setEnabled(SUB81(pQVar6,0));
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    }
    else {
      QAction::setEnabled(SUB81(pQVar6,0));
    }
    local_68.a.d.d = (Data *)0x0;
    local_2a8.a = L'\0';
    local_2a8._2_6_ = 0;
    local_2a8.b.d.d = (Data *)0x0;
    local_2a8.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.ptr = L"edit-delete";
    local_68.a.d.size = 0xb;
    QObject::doSetObjectName((QString *)pQVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8);
    local_2a8.a = L'\0';
    local_2a8._2_6_ = 0;
    local_2a8.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-delete";
    local_2a8.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 0xb;
    setActionIcon(pQVar6,&local_68.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8);
    local_68.a.d.d = (Data *)QWidgetLineControl::_q_deleteSelected;
    local_68.a.d.ptr = (char16_t *)0x0;
    QObject::connect<void(QAction::*)(bool),void(QWidgetLineControl::*)()>
              (local_260,(offset_in_QAction_to_subr)pQVar6,(ContextType *)QAction::triggered,
               (offset_in_QWidgetLineControl_to_subr *)0x0,
               (ConnectionType)*(undefined8 *)(lVar1 + 600));
    QMetaObject::Connection::~Connection((Connection *)local_260);
  }
  bVar4 = QMenu::isEmpty((QMenu *)this_00.m_data);
  if (!bVar4) {
    QMenu::addSeparator((QMenu *)this_00.m_data);
  }
  tr((QString *)&local_1f8,"Select All",(char *)0x0,-1);
  bVar2 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
  if (bVar2 == 0) {
    pQVar7 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
    QKeySequence::QKeySequence(local_280,SelectAll);
    cVar3 = QShortcutMap::hasShortcutForKeySequence(pQVar7);
    if (cVar3 == '\0') {
      QKeySequence::QKeySequence(local_2d0,SelectAll);
      QKeySequence::toString((SequenceFormat)&local_2c8);
      local_2a8.b.d.size = local_2c8.size;
      local_2a8.b.d.ptr = local_2c8.ptr;
      local_2a8.b.d.d = local_2c8.d;
      local_2a8.a = L'\t';
      local_2c8.d = (Data *)0x0;
      local_2c8.ptr = (char16_t *)0x0;
      local_2c8.size = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_278,&local_2a8);
      bVar2 = 1;
      bVar4 = true;
      goto LAB_003eee6d;
    }
  }
  bVar2 = bVar2 ^ 1;
  local_278.d = (Data *)0x0;
  local_278.ptr = (char16_t *)0x0;
  local_278.size = 0;
  bVar4 = false;
LAB_003eee6d:
  QStringBuilder<QString,_QString>::QStringBuilder
            (&local_68,(QString *)&local_1f8,(QString *)&local_278);
  QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_178,&local_68);
  pQVar6 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_178);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
  QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_278);
  if (bVar4) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2a8.b.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2c8);
    QKeySequence::~QKeySequence(local_2d0);
  }
  if (bVar2 != 0) {
    QKeySequence::~QKeySequence(local_280);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1f8);
  QWidgetLineControl::text(&local_68.a,*(QWidgetLineControl **)(lVar1 + 600));
  if (local_68.a.d.size != 0) {
    QWidgetLineControl::allSelected(*(QWidgetLineControl **)(lVar1 + 600));
  }
  QAction::setEnabled(SUB81(pQVar6,0));
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  local_68.a.d.d = (Data *)0x0;
  local_178.d = (Data *)0x0;
  local_178.ptr = (char16_t *)0x0;
  local_68.a.d.ptr = L"select-all";
  local_178.size = 0;
  local_68.a.d.size = 10;
  QObject::doSetObjectName((QString *)pQVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
  local_68.a.d.d = (Data *)0x0;
  local_178.d = (Data *)0x0;
  local_178.ptr = (char16_t *)0x0;
  local_68.a.d.ptr = L"edit-select-all";
  local_178.size = 0;
  local_68.a.d.size = 0xf;
  setActionIcon(pQVar6,&local_68.a);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
  QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)(lVar1 + 0x260),(QObject *)pQVar6)
  ;
  local_68.a.d.d = (Data *)selectAll;
  local_68.a.d.ptr = (char16_t *)0x0;
  QObject::connect<void(QAction::*)(bool),void(QLineEdit::*)()>
            (local_2d8,(offset_in_QAction_to_subr)pQVar6,(ContextType *)QAction::triggered,
             (offset_in_QLineEdit_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_2d8);
  if ((*(byte *)(*(long *)(lVar1 + 600) + 0x50) & 4) == 0) {
    QGuiApplication::styleHints();
    cVar3 = QStyleHints::useRtlExtensions();
    if (cVar3 != '\0') {
      QMenu::addSeparator((QMenu *)this_00.m_data);
      this_01 = (QUnicodeControlCharacterMenu *)operator_new(0x30);
      QUnicodeControlCharacterMenu::QUnicodeControlCharacterMenu
                (this_01,(QObject *)this,(QWidget *)this_00.m_data);
      QMenu::addMenu((QMenu *)this_00.m_data,(QMenu *)this_01);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QMenu *)this_00.m_data;
  }
  __stack_chk_fail();
}

Assistant:

QMenu *QLineEdit::createStandardContextMenu()
{
    Q_D(QLineEdit);
    QMenu *popup = new QMenu(this);
    popup->setObjectName("qt_edit_menu"_L1);
    QAction *action = nullptr;

    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("&Undo") + ACCEL_KEY(QKeySequence::Undo));
        action->setEnabled(d->control->isUndoAvailable());
        action->setObjectName(QStringLiteral("edit-undo"));
        setActionIcon(action, QStringLiteral("edit-undo"));
        connect(action, &QAction::triggered, this, &QLineEdit::undo);

        action = popup->addAction(QLineEdit::tr("&Redo") + ACCEL_KEY(QKeySequence::Redo));
        action->setEnabled(d->control->isRedoAvailable());
        action->setObjectName(QStringLiteral("edit-redo"));
        setActionIcon(action, QStringLiteral("edit-redo"));
        connect(action, &QAction::triggered, this, &QLineEdit::redo);

        popup->addSeparator();
    }

#ifndef QT_NO_CLIPBOARD
    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("Cu&t") + ACCEL_KEY(QKeySequence::Cut));
        action->setEnabled(!d->control->isReadOnly() && d->control->hasSelectedText()
                && d->control->echoMode() == QLineEdit::Normal);
        action->setObjectName(QStringLiteral("edit-cut"));
        setActionIcon(action, QStringLiteral("edit-cut"));
        connect(action, &QAction::triggered, this, &QLineEdit::cut);
    }

    action = popup->addAction(QLineEdit::tr("&Copy") + ACCEL_KEY(QKeySequence::Copy));
    action->setEnabled(d->control->hasSelectedText()
            && d->control->echoMode() == QLineEdit::Normal);
    action->setObjectName(QStringLiteral("edit-copy"));
    setActionIcon(action, QStringLiteral("edit-copy"));
    connect(action, &QAction::triggered, this, &QLineEdit::copy);

    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("&Paste") + ACCEL_KEY(QKeySequence::Paste));
        action->setEnabled(!d->control->isReadOnly() && !QGuiApplication::clipboard()->text().isEmpty());
        action->setObjectName(QStringLiteral("edit-paste"));
        setActionIcon(action, QStringLiteral("edit-paste"));
        connect(action, &QAction::triggered, this, &QLineEdit::paste);
    }
#endif

    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("Delete"));
        action->setEnabled(!d->control->isReadOnly() && !d->control->text().isEmpty() && d->control->hasSelectedText());
        action->setObjectName(QStringLiteral("edit-delete"));
        setActionIcon(action, QStringLiteral("edit-delete"));
        connect(action, &QAction::triggered,
                d->control, &QWidgetLineControl::_q_deleteSelected);
    }

    if (!popup->isEmpty())
        popup->addSeparator();

    action = popup->addAction(QLineEdit::tr("Select All") + ACCEL_KEY(QKeySequence::SelectAll));
    action->setEnabled(!d->control->text().isEmpty() && !d->control->allSelected());
    action->setObjectName(QStringLiteral("select-all"));
    setActionIcon(action, QStringLiteral("edit-select-all"));
    d->selectAllAction = action;
    connect(action, &QAction::triggered, this, &QLineEdit::selectAll);

    if (!d->control->isReadOnly() && QGuiApplication::styleHints()->useRtlExtensions()) {
        popup->addSeparator();
        QUnicodeControlCharacterMenu *ctrlCharacterMenu = new QUnicodeControlCharacterMenu(this, popup);
        popup->addMenu(ctrlCharacterMenu);
    }
    return popup;
}